

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

CatalogException *
duckdb::Catalog::CreateMissingEntryException
          (CatalogException *__return_storage_ptr__,CatalogEntryRetriever *retriever,
          EntryLookupInfo *lookup_info,reference_set_t<SchemaCatalogEntry> *schemas)

{
  double dVar1;
  CatalogType CVar2;
  string *this;
  AttachedDatabase *pAVar3;
  pointer pcVar4;
  undefined8 uVar5;
  undefined1 auVar6 [8];
  DatabaseManager *this_00;
  DBConfig *this_01;
  RETURN_TYPE RVar7;
  long *plVar8;
  reference pvVar9;
  undefined8 *puVar10;
  reference pvVar11;
  long lVar12;
  pointer pbVar13;
  ulong *puVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  CatalogType type;
  CatalogType extraout_DL;
  CatalogType extraout_DL_00;
  CatalogType extraout_DL_01;
  CatalogType CVar16;
  CatalogType extraout_DL_02;
  CatalogType type_00;
  CatalogType type_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar17;
  undefined8 extraout_RDX_01;
  iterator __end3;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> *this_02;
  pointer pSVar18;
  uint uVar19;
  duckdb *this_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  uint uVar22;
  pointer prVar23;
  ClientContext *pCVar24;
  uint uVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  double dVar27;
  pair<std::__detail::_Node_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true,_true>,_bool>
  pVar28;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar29;
  string did_you_mean;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  suggestions;
  string schema_name;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_true>
  lookup_result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  other_types;
  string extension_name;
  vector<duckdb::SimilarCatalogEntry,_true> unseen_entries;
  vector<duckdb::SimilarCatalogEntry,_true> entries;
  bool qualify_schema;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> databases;
  reference_set_t<SchemaCatalogEntry> unseen_schemas;
  string local_2e8;
  undefined1 local_2c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  _Base_ptr local_2a8;
  ulong local_2a0;
  string local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  CatalogException *local_258;
  ClientContext *local_250;
  undefined1 local_248 [24];
  long lStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  EntryLookupInfo *local_208;
  vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_> local_200;
  vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_> local_1e8;
  string local_1d0;
  CatalogEntryRetriever *local_1b0;
  pointer local_1a8;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> local_1a0;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a8;
  string local_70;
  string local_50;
  uint uVar20;
  
  pCVar24 = retriever->context;
  local_258 = __return_storage_ptr__;
  local_208 = lookup_info;
  local_1b0 = retriever;
  SimilarEntriesInSchemas
            ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_1e8,pCVar24,lookup_info,schemas);
  local_a8._M_buckets = &local_a8._M_single_bucket;
  local_a8._M_bucket_count = 1;
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = DatabaseManager::Get(pCVar24);
  DatabaseManager::GetDatabases(&local_1a0,this_00,pCVar24);
  this_01 = DBConfig::GetConfig(pCVar24);
  local_250 = pCVar24;
  RVar7 = DBConfig::GetSetting<duckdb::CatalogErrorMaxSchemasSetting>(this_01,pCVar24);
  CVar16 = (CatalogType)extraout_RDX;
  local_1a8 = local_1a0.
              super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1a0.
      super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1a0.
      super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar17 = extraout_RDX;
    prVar23 = local_1a0.
              super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      CVar16 = (CatalogType)uVar17;
      if (RVar7 <= local_a8._M_element_count) break;
      AttachedDatabase::GetCatalog(prVar23->_M_data);
      GetAllSchemas((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *)local_2c8,
                    local_250);
      paVar21 = local_2c0;
      uVar17 = extraout_RDX_00;
      auVar6 = local_2c8;
      while ((auVar6 != (undefined1  [8])paVar21 && (local_a8._M_element_count < RVar7))) {
        local_2e8._M_dataplus._M_p = *(pointer *)auVar6;
        local_228._M_allocated_capacity = (size_type)&local_a8;
        pVar28 = ::std::
                 _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::
                 _M_insert<std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::reference_wrapper<duckdb::SchemaCatalogEntry>,true>>>>
                           ((_Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)&local_a8,&local_2e8,&local_228);
        uVar17 = pVar28._8_8_;
        auVar6 = (undefined1  [8])((long)auVar6 + 8);
      }
      if (local_2c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_2c8);
        uVar17 = extraout_RDX_01;
      }
      CVar16 = (CatalogType)uVar17;
      prVar23 = prVar23 + 1;
    } while (prVar23 != local_1a8);
  }
  pCVar24 = local_250;
  local_228._M_allocated_capacity = (size_type)&local_218;
  local_228._8_8_ = 0;
  local_218._M_local_buf[0] = '\0';
  CVar2 = local_208->catalog_type;
  this_03 = (duckdb *)(ulong)CVar2;
  this = local_208->name;
  uVar19 = (uint)CVar2;
  uVar20 = (uint)CVar2;
  if ((byte)(CVar2 - TABLE_FUNCTION_ENTRY) < 4) {
    ExtensionHelper::FindExtensionInFunctionEntries<706ul>
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_true>
                *)&local_278,(ExtensionHelper *)this,(string *)"!__postfix",
               (ExtensionFunctionEntry (*) [706])schemas);
    uVar17 = local_278._8_8_;
    if (local_278._M_allocated_capacity != local_278._8_8_) {
      local_248._0_8_ = (pointer)0x0;
      local_248._8_8_ = (pointer)0x0;
      local_248._16_8_ = (pointer)0x0;
      local_2c8 = (undefined1  [8])&local_2b8;
      local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_2b8._M_allocated_capacity = local_2b8._M_allocated_capacity & 0xffffffffffffff00;
      uVar5 = local_278._M_allocated_capacity;
      do {
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(uVar5 + 0x28);
        CVar16 = (CatalogType)*(long *)(uVar5 + 0x20);
        uVar25 = 1;
        uVar22 = (uint)CVar16;
        if ((((CVar2 != CVar16) && (uVar25 = 0, uVar19 < 0x20)) &&
            (((0x4c000000U >> (uVar20 & 0x1f) & 1) == 0 ||
             (((0x1e < uVar22 || (uVar25 = 1, (0x4c000000U >> (uVar22 & 0x1f) & 1) == 0)) &&
              (uVar25 = 0, uVar20 < 0x20)))))) &&
           (uVar25 = 0, (0x92000000U >> (uVar19 & 0x1f) & 1) != 0)) {
          if (CVar16 < 0x20) {
            uVar25 = 0x92000000 >> (CVar16 & TABLE_MACRO_ENTRY);
          }
          else {
            uVar25 = 0;
          }
        }
        if ((uVar25 & 1) == 0) {
          ::std::__cxx11::string::_M_assign((string *)local_2c8);
          CatalogTypeToString_abi_cxx11_(&local_2e8,(duckdb *)(ulong)uVar22,type);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_248,
                     &local_2e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p);
          }
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)local_228._M_local_buf);
        }
        uVar5 = paVar21;
      } while ((uVar25 & 1) == 0 &&
               paVar21 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)uVar17);
      if (local_228._8_8_ == 0) {
        if (local_248._8_8_ - local_248._0_8_ == 0x20) {
          pvVar11 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  *)local_248,0);
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2e8,
                     "%s with name \"%s\" is not in the catalog, a function by this name exists in the %s extension, but it\'s of a different type, namely %s"
                     ,"");
          CatalogTypeToString_abi_cxx11_(&local_50,this_03,type_00);
          pcVar4 = (this->_M_dataplus)._M_p;
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar4,pcVar4 + this->_M_string_length);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,local_2c8,(char *)((long)local_2c8 + (long)local_2c0));
          pcVar4 = (pvVar11->_M_dataplus)._M_p;
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,pcVar4,pcVar4 + pvVar11->_M_string_length);
          CatalogException::
          CatalogException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (local_258,&local_2e8,&local_50,&local_c8,&local_e8,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00266051:
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        else {
          paVar21 = &local_298.field_2;
          local_298._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,", ","");
          StringUtil::Join(&local_2e8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)local_248,&local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != paVar21) {
            operator_delete(local_298._M_dataplus._M_p);
          }
          local_298._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_298,
                     "%s with name \"%s\" is not in the catalog, functions with this name exist in the %s extension, but they are of different types, namely %s"
                     ,"");
          CatalogTypeToString_abi_cxx11_(&local_70,this_03,type_01);
          pcVar4 = (this->_M_dataplus)._M_p;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,pcVar4,pcVar4 + this->_M_string_length);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_2c8,(char *)((long)local_2c8 + (long)local_2c0));
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,local_2e8._M_dataplus._M_p,
                     local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
          CatalogException::
          CatalogException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (local_258,&local_298,&local_70,&local_128,&local_148,&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          local_50._M_dataplus._M_p = local_298._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != paVar21) goto LAB_00266051;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p);
        }
        if (local_2c8 != (undefined1  [8])&local_2b8) {
          operator_delete((void *)local_2c8);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_248);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
                   *)&local_278);
        goto LAB_00266625;
      }
      if (local_2c8 != (undefined1  [8])&local_2b8) {
        operator_delete((void *)local_2c8);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_248);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
               *)&local_278);
    pCVar24 = local_250;
    CVar16 = extraout_DL;
  }
  else if (uVar20 == 7) {
    ExtensionHelper::FindExtensionInEntries<130ul>
              ((string *)local_2c8,(ExtensionHelper *)this,(string *)&EXTENSION_COLLATIONS,
               (ExtensionEntry (*) [130])schemas);
    ::std::__cxx11::string::operator=((string *)local_228._M_local_buf,(string *)local_2c8);
    pCVar24 = local_250;
    CVar16 = extraout_DL_02;
    if (local_2c8 != (undefined1  [8])&local_2b8) goto LAB_00265b2e;
  }
  else {
    if (uVar20 == 0x1d) {
      ExtensionHelper::FindExtensionInEntries<2ul>
                ((string *)local_2c8,(ExtensionHelper *)this,(string *)"parquet",
                 (ExtensionEntry (*) [2])schemas);
    }
    else {
      if (uVar19 != 8) goto LAB_00265b33;
      ExtensionHelper::FindExtensionInEntries<3ul>
                ((string *)local_2c8,(ExtensionHelper *)this,(string *)&EXTENSION_TYPES,
                 (ExtensionEntry (*) [3])schemas);
    }
    ::std::__cxx11::string::operator=((string *)local_228._M_local_buf,(string *)local_2c8);
    CVar16 = extraout_DL_00;
    if (local_2c8 != (undefined1  [8])&local_2b8) {
LAB_00265b2e:
      operator_delete((void *)local_2c8);
      CVar16 = extraout_DL_01;
    }
  }
LAB_00265b33:
  if (local_228._8_8_ != 0) {
    CatalogTypeToString_abi_cxx11_(&local_1d0,this_03,CVar16);
    plVar8 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
    pbVar13 = (pointer)(plVar8 + 2);
    if ((pointer)*plVar8 == pbVar13) {
      local_248._16_8_ = (pbVar13->_M_dataplus)._M_p;
      lStack_230 = plVar8[3];
      local_248._0_8_ = (pointer)(local_248 + 0x10);
    }
    else {
      local_248._16_8_ = (pbVar13->_M_dataplus)._M_p;
      local_248._0_8_ = (pointer)*plVar8;
    }
    local_248._8_8_ = plVar8[1];
    *plVar8 = (long)pbVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)::std::__cxx11::string::_M_append(local_248,(ulong)(this->_M_dataplus)._M_p);
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar21) {
      local_268._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_268._8_8_ = plVar8[3];
      local_278._M_allocated_capacity = (size_type)&local_268;
    }
    else {
      local_268._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_278._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar8;
    }
    local_278._8_8_ = plVar8[1];
    *plVar8 = (long)paVar21;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar10 = (undefined8 *)::std::__cxx11::string::append(local_278._M_local_buf);
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 == paVar21) {
      local_298.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_298.field_2._8_8_ = puVar10[3];
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    }
    else {
      local_298.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_298._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_298._M_string_length = puVar10[1];
    *puVar10 = paVar21;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar8 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_298,local_228._M_allocated_capacity);
    paVar21 = &local_2e8.field_2;
    puVar14 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_2e8.field_2._M_allocated_capacity = *puVar14;
      local_2e8.field_2._8_8_ = plVar8[3];
      local_2e8._M_dataplus._M_p = (pointer)paVar21;
    }
    else {
      local_2e8.field_2._M_allocated_capacity = *puVar14;
      local_2e8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_2e8._M_string_length = plVar8[1];
    *plVar8 = (long)puVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_2e8);
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 == paVar26) {
      local_2b8._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_2b8._8_8_ = puVar10[3];
      local_2c8 = (undefined1  [8])&local_2b8;
    }
    else {
      local_2b8._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_2c8 = (undefined1  [8])*puVar10;
    }
    local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10[1];
    *puVar10 = paVar26;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != paVar21) {
      operator_delete(local_2e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_allocated_capacity != &local_268) {
      operator_delete((void *)local_278._M_allocated_capacity);
    }
    if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
      operator_delete((void *)local_248._0_8_);
    }
    if ((void *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) !=
        (void *)((long)&local_1d0 + 0x10U)) {
      operator_delete((void *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,
                                       local_1d0._M_dataplus._M_p._0_1_));
    }
    ExtensionHelper::AddExtensionInstallHintToErrorMsg
              (&local_2e8,local_250,(string *)local_2c8,(string *)&local_228);
    ::std::__cxx11::string::operator=((string *)local_2c8,(string *)&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != paVar21) {
      operator_delete(local_2e8._M_dataplus._M_p);
    }
    CatalogException::CatalogException(local_258,(string *)local_2c8);
    if (local_2c8 != (undefined1  [8])&local_2b8) {
      operator_delete((void *)local_2c8);
    }
    goto LAB_00266625;
  }
  SimilarEntriesInSchemas
            ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_200,pCVar24,local_208,
             (reference_set_t<SchemaCatalogEntry> *)&local_a8);
  local_2b8._8_8_ = &local_2c0;
  local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((ulong)local_2c0 & 0xffffffff00000000);
  local_2b8._M_allocated_capacity = 0;
  local_2a0 = 0;
  local_2a8 = (_Base_ptr)local_2b8._8_8_;
  if (local_200.
      super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_200.
      super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
LAB_0026635e:
    if (local_1e8.
        super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1e8.
        super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pSVar18 = local_1e8.
                super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_2c8,&pSVar18->name);
        pSVar18 = pSVar18 + 1;
      } while (pSVar18 !=
               local_1e8.
               super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    pvVar9 = vector<duckdb::SimilarCatalogEntry,_true>::operator[]
                       ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_200,0);
    if ((pvVar9->score != 1.0) || (NAN(pvVar9->score))) {
      pvVar9 = vector<duckdb::SimilarCatalogEntry,_true>::operator[]
                         ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_200,0);
      dVar1 = pvVar9->score;
      if (local_1e8.
          super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_1e8.
          super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        dVar27 = 0.0;
      }
      else {
        pvVar9 = vector<duckdb::SimilarCatalogEntry,_true>::operator[]
                           ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_1e8,0);
        dVar27 = pvVar9->score;
      }
      if (dVar1 + -0.2 <= dVar27) goto LAB_0026635e;
    }
    if (local_200.
        super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_200.
        super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_02 = &(local_200.
                  super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start)->schema;
      do {
        optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(this_02);
        pAVar3 = ((this_02->ptr->super_InCatalogEntry).catalog)->db;
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        pcVar4 = (pAVar3->super_CatalogEntry).name._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e8,pcVar4,
                   pcVar4 + (pAVar3->super_CatalogEntry).name._M_string_length);
        optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(this_02);
        pcVar4 = (this_02->ptr->super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,pcVar4,
                   pcVar4 + (this_02->ptr->super_InCatalogEntry).super_CatalogEntry.name.
                            _M_string_length);
        FindMinimalQualification
                  (local_1b0,&local_2e8,&local_298,(bool *)local_248,(bool *)&local_1d0);
        SimilarCatalogEntry::GetQualifiedName_abi_cxx11_
                  ((string *)&local_278,(SimilarCatalogEntry *)(this_02 + -5),(bool)local_248[0],
                   (bool)local_1d0._M_dataplus._M_p._0_1_);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_allocated_capacity != &local_268) {
          operator_delete((void *)local_278._M_allocated_capacity);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p);
        }
        pSVar18 = (pointer)(this_02 + 1);
        this_02 = this_02 + 6;
      } while (pSVar18 !=
               local_200.
               super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  paVar21 = &local_2e8.field_2;
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_allocated_capacity =
       local_2e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_2e8._M_dataplus._M_p = (pointer)paVar21;
  if (local_2a0 < 3) {
    paVar26 = &local_268;
    local_278._M_allocated_capacity = (size_type)paVar26;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_278," or ","");
    StringUtil::Join(&local_298,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2c8,(string *)&local_278);
    ::std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_298);
    uVar17 = local_278._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p);
      uVar17 = local_278._M_allocated_capacity;
    }
  }
  else {
    lVar12 = ::std::_Rb_tree_decrement((_Rb_tree_node_base *)&local_2c0);
    paVar26 = &local_298.field_2;
    local_298._M_dataplus._M_p = (pointer)paVar26;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,*(long *)(lVar12 + 0x20),
               *(long *)(lVar12 + 0x28) + *(long *)(lVar12 + 0x20));
    pVar29 = ::std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2c8,&local_298);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2c8,(_Base_ptr)pVar29.first._M_node,(_Base_ptr)pVar29.second._M_node);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,", ","");
    StringUtil::Join(&local_1d0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2c8,&local_188);
    plVar8 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
    pbVar13 = (pointer)(plVar8 + 2);
    if ((pointer)*plVar8 == pbVar13) {
      local_248._16_8_ = (pbVar13->_M_dataplus)._M_p;
      lStack_230 = plVar8[3];
      local_248._0_8_ = (pointer)(local_248 + 0x10);
    }
    else {
      local_248._16_8_ = (pbVar13->_M_dataplus)._M_p;
      local_248._0_8_ = (pointer)*plVar8;
    }
    local_248._8_8_ = plVar8[1];
    *plVar8 = (long)pbVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar10 = (undefined8 *)
              ::std::__cxx11::string::_M_append(local_248,(ulong)local_298._M_dataplus._M_p);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 == paVar15) {
      local_268._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_268._8_8_ = puVar10[3];
      local_278._M_allocated_capacity = (size_type)&local_268;
    }
    else {
      local_268._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_278._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar10;
    }
    local_278._8_8_ = puVar10[1];
    *puVar10 = paVar15;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_278._M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_allocated_capacity != &local_268) {
      operator_delete((void *)local_278._M_allocated_capacity);
    }
    if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
      operator_delete((void *)local_248._0_8_);
    }
    if ((void *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) !=
        (void *)((long)&local_1d0 + 0x10U)) {
      operator_delete((void *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,
                                       local_1d0._M_dataplus._M_p._0_1_));
    }
    uVar17 = local_298._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
      uVar17 = local_298._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uVar17 != paVar26) {
    operator_delete((void *)uVar17);
  }
  CatalogException::MissingEntry(local_258,local_208,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != paVar21) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2c8);
  ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::~vector
            (&local_200);
LAB_00266625:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_allocated_capacity != &local_218) {
    operator_delete((void *)local_228._M_allocated_capacity);
  }
  if (local_1a0.
      super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.
                    super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_a8);
  ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::~vector
            (&local_1e8);
  return local_258;
}

Assistant:

CatalogException Catalog::CreateMissingEntryException(CatalogEntryRetriever &retriever,
                                                      const EntryLookupInfo &lookup_info,
                                                      const reference_set_t<SchemaCatalogEntry> &schemas) {
	auto &context = retriever.GetContext();
	auto entries = SimilarEntriesInSchemas(context, lookup_info, schemas);

	reference_set_t<SchemaCatalogEntry> unseen_schemas;
	auto &db_manager = DatabaseManager::Get(context);
	auto databases = db_manager.GetDatabases(context);
	auto &config = DBConfig::GetConfig(context);

	auto max_schema_count = config.GetSetting<CatalogErrorMaxSchemasSetting>(context);
	for (auto database : databases) {
		if (unseen_schemas.size() >= max_schema_count) {
			break;
		}
		auto &catalog = database.get().GetCatalog();
		auto current_schemas = catalog.GetAllSchemas(context);
		for (auto &current_schema : current_schemas) {
			if (unseen_schemas.size() >= max_schema_count) {
				break;
			}
			unseen_schemas.insert(current_schema.get());
		}
	}
	// check if the entry exists in any extension
	string extension_name;
	auto type = lookup_info.GetCatalogType();
	auto &entry_name = lookup_info.GetEntryName();
	if (type == CatalogType::TABLE_FUNCTION_ENTRY || type == CatalogType::SCALAR_FUNCTION_ENTRY ||
	    type == CatalogType::AGGREGATE_FUNCTION_ENTRY || type == CatalogType::PRAGMA_FUNCTION_ENTRY) {
		auto lookup_result = ExtensionHelper::FindExtensionInFunctionEntries(entry_name, EXTENSION_FUNCTIONS);
		do {
			if (lookup_result.empty()) {
				break;
			}
			vector<string> other_types;
			string extension_for_error;
			for (auto &function : lookup_result) {
				auto function_type = function.second;
				if (CompareCatalogTypes(type, function_type)) {
					extension_name = function.first;
					break;
				}
				extension_for_error = function.first;
				other_types.push_back(CatalogTypeToString(function_type));
			}
			if (!extension_name.empty()) {
				break;
			}
			if (other_types.size() == 1) {
				auto &function_type = other_types[0];
				auto error =
				    CatalogException("%s with name \"%s\" is not in the catalog, a function by this name exists "
				                     "in the %s extension, but it's of a different type, namely %s",
				                     CatalogTypeToString(type), entry_name, extension_for_error, function_type);
				return error;
			} else {
				D_ASSERT(!other_types.empty());
				auto list_of_types = StringUtil::Join(other_types, ", ");
				auto error =
				    CatalogException("%s with name \"%s\" is not in the catalog, functions with this name exist "
				                     "in the %s extension, but they are of different types, namely %s",
				                     CatalogTypeToString(type), entry_name, extension_for_error, list_of_types);
				return error;
			}
		} while (false);
	} else if (type == CatalogType::TYPE_ENTRY) {
		extension_name = ExtensionHelper::FindExtensionInEntries(entry_name, EXTENSION_TYPES);
	} else if (type == CatalogType::COPY_FUNCTION_ENTRY) {
		extension_name = ExtensionHelper::FindExtensionInEntries(entry_name, EXTENSION_COPY_FUNCTIONS);
	} else if (type == CatalogType::COLLATION_ENTRY) {
		extension_name = ExtensionHelper::FindExtensionInEntries(entry_name, EXTENSION_COLLATIONS);
	}

	// if we found an extension that can handle this catalog entry, create an error hinting the user
	if (!extension_name.empty()) {
		auto error_message = CatalogTypeToString(type) + " with name \"" + entry_name +
		                     "\" is not in the catalog, but it exists in the " + extension_name + " extension.";
		error_message = ExtensionHelper::AddExtensionInstallHintToErrorMsg(context, error_message, extension_name);
		return CatalogException(error_message);
	}

	// entries in other schemas get a penalty
	// however, if there is an exact match in another schema, we will always show it
	static constexpr const double UNSEEN_PENALTY = 0.2;
	auto unseen_entries = SimilarEntriesInSchemas(context, lookup_info, unseen_schemas);
	set<string> suggestions;
	if (!unseen_entries.empty() && (unseen_entries[0].score == 1.0 || unseen_entries[0].score - UNSEEN_PENALTY >
	                                                                      (entries.empty() ? 0.0 : entries[0].score))) {
		// the closest matching entry requires qualification as it is not in the default search path
		// check how to minimally qualify this entry
		for (auto &unseen_entry : unseen_entries) {
			auto catalog_name = unseen_entry.schema->catalog.GetName();
			auto schema_name = unseen_entry.schema->name;
			bool qualify_database;
			bool qualify_schema;
			FindMinimalQualification(retriever, catalog_name, schema_name, qualify_database, qualify_schema);
			auto qualified_name = unseen_entry.GetQualifiedName(qualify_database, qualify_schema);
			suggestions.insert(qualified_name);
		}
	} else if (!entries.empty()) {
		for (auto &entry : entries) {
			suggestions.insert(entry.name);
		}
	}

	string did_you_mean;
	if (suggestions.size() > 2) {
		string last = *suggestions.rbegin();
		suggestions.erase(last);
		did_you_mean = StringUtil::Join(suggestions, ", ") + ", or " + last;
	} else {
		did_you_mean = StringUtil::Join(suggestions, " or ");
	}

	return CatalogException::MissingEntry(lookup_info, did_you_mean);
}